

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99ParamsGen(stb99_params *params,stb99_seed *seed)

{
  long lVar1;
  bool_t bVar2;
  qr_o *n_00;
  ulong no_00;
  size_t sVar3;
  void *stack_00;
  word *q;
  word *a_00;
  gen_i rng;
  void *rng_state;
  void *stack_01;
  code *src;
  gen_i n_01;
  size_t sVar4;
  gen_i a_01;
  gen_i b;
  gen_i a_02;
  gen_i a_03;
  gen_i q_00;
  stb99_seed *count;
  qr_o *pqVar5;
  octet *poVar6;
  gen_i p_Var7;
  size_t *in_RSI;
  size_t *in_RDI;
  void *stack;
  qr_o *qr;
  word *a;
  word *d;
  word *p;
  word *g0;
  word *fi;
  word *gi;
  octet *stb_state;
  void *state;
  size_t base_count;
  size_t trials;
  size_t offset;
  size_t fw;
  size_t gw;
  size_t mo;
  size_t m;
  size_t no;
  size_t n;
  size_t i;
  err_t code;
  size_t in_stack_fffffffffffffe98;
  gen_i in_stack_fffffffffffffea0;
  code *in_stack_fffffffffffffea8;
  gen_i in_stack_fffffffffffffeb0;
  stb99_seed *in_stack_fffffffffffffeb8;
  gen_i in_stack_fffffffffffffec0;
  octet *in_stack_fffffffffffffec8;
  qr_o *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffef0;
  qr_o *r;
  qr_o *r_00;
  stb99_seed *psVar8;
  gen_i a_04;
  gen_i q_01;
  gen_i p_Var9;
  gen_i base_count_00;
  void *stack_02;
  void *local_68;
  ulong local_60;
  ulong local_38;
  err_t local_14;
  
  local_14 = stb99SeedVal((stb99_seed *)in_stack_fffffffffffffea8);
  if (local_14 == 0) {
    bVar2 = memIsValid(in_RDI,0x3d0);
    if (bVar2 == 0) {
      local_14 = 0x6d;
    }
    else {
      memSet(in_stack_fffffffffffffea0,(octet)(in_stack_fffffffffffffe98 >> 0x38),0x179616);
      *in_RDI = *in_RSI;
      for (local_38 = 0; (local_38 < 10 && (_ls[local_38] != *in_RDI)); local_38 = local_38 + 1) {
      }
      in_RDI[1] = _rs[local_38];
      local_38 = 1;
      local_68 = (void *)(in_RSI[0x1b] + 0x3f >> 6);
      for (; 0x20 < in_RSI[local_38 + 0x1b]; local_38 = local_38 + 1) {
        local_68 = (void *)((in_RSI[local_38 + 0x1b] + 0x3f >> 6) + (long)local_68);
      }
      local_38 = 1;
      local_60 = in_RSI[9] + 0x3f >> 6;
      for (; 0x20 < in_RSI[local_38 + 9]; local_38 = local_38 + 1) {
        local_60 = (in_RSI[local_38 + 9] + 0x3f >> 6) + local_60;
      }
      n_00 = (qr_o *)(*in_RDI + 0x3f >> 6);
      no_00 = *in_RDI + 7 >> 3;
      sVar4 = in_RDI[1];
      sVar3 = prngSTB_keep();
      stack_00 = (void *)(sVar3 + (local_60 + 1) * 8 +
                         ((in_RSI[9] + 0x3f >> 6) + (long)n_00 * 2) * 8);
      zmMontCreate_keep(no_00);
      q = (word *)priNextPrimeW_deep();
      a_00 = (word *)priExtendPrime_deep((size_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                                         ,0x179909);
      rng = (gen_i)priExtendPrime2_deep
                             (in_stack_fffffffffffffef0,(size_t)stack_00,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed8);
      rng_state = (void *)zmMontCreate_deep((size_t)in_stack_fffffffffffffec0);
      stack_01 = (void *)zzDiv_deep((size_t)n_00,sVar4 + 0x3f >> 6);
      r = n_00;
      r_00 = n_00;
      zmMontCreate_deep((size_t)in_stack_fffffffffffffec0);
      src = (code *)qrPower_deep((size_t)in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8
                                 ,(size_t)in_stack_fffffffffffffea0);
      utilMax(6,q,a_00,rng,rng_state,stack_01);
      n_01 = (gen_i)blobCreate((size_t)src);
      if (n_01 == (gen_i)0x0) {
        local_14 = 0x6e;
      }
      else {
        p_Var9 = n_01;
        base_count_00 = n_01;
        sVar4 = prngSTB_keep();
        a_01 = n_01 + sVar4;
        b = a_01 + (local_60 + 1) * 8;
        a_02 = b + (in_RSI[9] + 0x3f >> 6) * 8;
        a_03 = a_02 + (long)n_00 * 8;
        q_00 = a_03 + (long)n_00 * 8;
        a_04 = q_00;
        q_01 = a_01;
        sVar4 = zmMontCreate_keep(no_00);
        count = (stb99_seed *)(q_00 + sVar4);
        prngSTBStart(in_stack_fffffffffffffeb0,(u16 *)in_stack_fffffffffffffea8);
LAB_00179b63:
        for (; 0x20 < in_RSI[local_38 + 9]; local_38 = local_38 + 1) {
          in_stack_fffffffffffffed0 = (qr_o *)(in_RSI[local_38 + 9] + 3 >> 2);
          pqVar5 = (qr_o *)priBaseSize();
          in_stack_fffffffffffffea8 = (code *)count;
          in_stack_fffffffffffffea0 = p_Var9;
          if (pqVar5 < in_stack_fffffffffffffed0) {
            priBaseSize();
            in_stack_fffffffffffffea8 = (code *)count;
            in_stack_fffffffffffffea0 = p_Var9;
          }
          src = prngSTBStepR;
          count = (stb99_seed *)in_stack_fffffffffffffea8;
          p_Var9 = in_stack_fffffffffffffea0;
          bVar2 = priExtendPrime((word *)r,(size_t)stack_00,(word *)q_00,(size_t)n_01,
                                 (size_t)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8
                                 ,rng,rng_state,stack_01);
          if (bVar2 != 0) goto LAB_00179e5b;
          local_60 = (in_RSI[local_38 + 9] + 0x3f >> 6) + local_60;
        }
        do {
          prngSTBStepR(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                       in_stack_fffffffffffffeb0);
          u64From((u64 *)in_stack_fffffffffffffea0,src,0x179c12);
          wwTrimHi((word *)(a_01 + local_60 * 8),1,in_RSI[local_38 + 9] - 1);
          wwSetBit((word *)(a_01 + local_60 * 8),in_RSI[local_38 + 9] - 1,1);
          bVar2 = priNextPrimeW((word *)in_stack_fffffffffffffea8,(word)in_stack_fffffffffffffea0,
                                src);
        } while (bVar2 == 0);
LAB_00179e5b:
        if (local_38 != 0) {
          local_60 = local_60 - (in_RSI[local_38 + 8] + 0x3f >> 6);
          local_38 = local_38 + -1;
          goto LAB_00179b63;
        }
        wwCopy((word *)b,(word *)a_01,in_RSI[9] + 0x3f >> 6);
        do {
          for (local_38 = 1; stack_02 = local_68, 0x20 < in_RSI[local_38 + 0x1b];
              local_38 = local_38 + 1) {
          }
LAB_00179f30:
          for (; 0x20 < in_RSI[local_38 + 0x1b]; local_38 = local_38 + 1) {
            in_stack_fffffffffffffec8 = (octet *)(in_RSI[local_38 + 0x1b] + 3 >> 2);
            poVar6 = (octet *)priBaseSize();
            in_stack_fffffffffffffea8 = (code *)count;
            in_stack_fffffffffffffea0 = p_Var9;
            if (poVar6 < in_stack_fffffffffffffec8) {
              priBaseSize();
              in_stack_fffffffffffffea8 = (code *)count;
              in_stack_fffffffffffffea0 = p_Var9;
            }
            src = prngSTBStepR;
            count = (stb99_seed *)in_stack_fffffffffffffea8;
            p_Var9 = in_stack_fffffffffffffea0;
            bVar2 = priExtendPrime((word *)r,(size_t)stack_00,(word *)q_00,(size_t)n_01,
                                   (size_t)in_stack_fffffffffffffed0,
                                   (size_t)in_stack_fffffffffffffec8,rng,rng_state,stack_01);
            if (bVar2 != 0) goto LAB_0017a249;
            lVar1 = local_38 + 0x1b;
            stack_02 = (void *)((in_RSI[lVar1] + 0x3f >> 6) + (long)stack_02);
          }
          do {
            prngSTBStepR(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                         in_stack_fffffffffffffeb0);
            u64From((u64 *)in_stack_fffffffffffffea0,src,0x179fe8);
            wwTrimHi((word *)(a_01 + (long)stack_02 * 8),1,in_RSI[local_38 + 0x1b] - 1);
            wwSetBit((word *)(a_01 + (long)stack_02 * 8),in_RSI[local_38 + 0x1b] - 1,1);
            bVar2 = priNextPrimeW((word *)in_stack_fffffffffffffea8,(word)in_stack_fffffffffffffea0,
                                  src);
          } while (bVar2 == 0);
LAB_0017a249:
          if (local_38 != 0) {
            stack_02 = (void *)((long)stack_02 - (in_RSI[local_38 + 0x1a] + 0x3f >> 6));
            local_38 = local_38 + -1;
            goto LAB_00179f30;
          }
          src = (code *)(in_RSI[9] << 2);
          in_stack_fffffffffffffec0 = (gen_i)(in_RSI[9] + 3 >> 2);
          in_stack_fffffffffffffea0 = in_stack_fffffffffffffec0;
          p_Var7 = (gen_i)priBaseSize();
          in_stack_fffffffffffffeb8 = count;
          in_stack_fffffffffffffeb0 = p_Var9;
          if (p_Var7 < in_stack_fffffffffffffec0) {
            in_stack_fffffffffffffea0 = (gen_i)priBaseSize();
            in_stack_fffffffffffffeb8 = count;
            in_stack_fffffffffffffeb0 = p_Var9;
          }
          in_stack_fffffffffffffea8 = prngSTBStepR;
          count = in_stack_fffffffffffffeb8;
          p_Var9 = in_stack_fffffffffffffeb0;
          bVar2 = priExtendPrime2((word *)b,(size_t)a_02,(word *)q_01,(size_t)a_03,(word *)a_04,
                                  (size_t)in_stack_fffffffffffffeb8,
                                  (size_t)in_stack_fffffffffffffeb0,(size_t)base_count_00,
                                  in_stack_fffffffffffffea0,src,stack_02);
        } while (bVar2 == 0);
        u64To(in_stack_fffffffffffffea0,(size_t)src,(u64 *)0x17a3cc);
        u64To(in_stack_fffffffffffffea0,(size_t)src,(u64 *)0x17a3f0);
        zmMontCreate(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (size_t)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0);
        zzSubW2((word *)a_02,(size_t)n_00,1);
        psVar8 = count;
        zzDiv(q,(word *)r_00,(word *)r,(size_t)stack_00,(word *)q_00,(size_t)n_01,rng);
        memSet(in_stack_fffffffffffffea0,(octet)((ulong)count >> 0x38),0x17a4a1);
        *(undefined1 *)((long)in_RDI + 0x299) = 5;
        (**(code **)(a_04 + 0x40))(q_01,(long)in_RDI + 0x299,a_04,psVar8);
        while( true ) {
          qrPower((word *)rng,a_00,q,(size_t)r_00,r,stack_00);
          bVar2 = wwEq((word *)a_03,*(word **)(a_04 + 0x20),*(size_t *)(a_04 + 0x30));
          if (bVar2 == 0) break;
          zzAddWMod((word *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->l,
                    (word)in_stack_fffffffffffffeb0,(word *)in_stack_fffffffffffffea8,
                    (size_t)in_stack_fffffffffffffea0);
        }
        u64To(in_stack_fffffffffffffea0,(size_t)count,(u64 *)0x17a5b2);
        u64To(in_stack_fffffffffffffea0,(size_t)count,(u64 *)0x17a5d6);
        blobClose((blob_t)0x17a5e3);
        local_14 = 0;
      }
    }
  }
  return local_14;
}

Assistant:

err_t stb99ParamsGen(stb99_params* params, const stb99_seed* seed)
{
	err_t code;
	size_t i;
	size_t n, no;
	size_t m, mo;
	size_t gw;			/* число слов для хранения gi */
	size_t fw;			/* число слов для хранения fi */
	size_t offset;
	size_t trials;
	size_t base_count;
	// состояние 
	void* state;
	octet* stb_state;
	word* gi;			/* промежуточные простые при построении g0 */
	word* fi;			/* промежуточные простые при построении q */
	word* g0;
	word* p;
	word* d;
	word* a;
	qr_o* qr;
	void* stack;
	// проверить seed
	code = stb99SeedVal(seed);
	ERR_CALL_CHECK(code);
	// подготовить params
	if (!memIsValid(params, sizeof(stb99_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(stb99_params));
	params->l = seed->l;
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == params->l)
			break;
	ASSERT(i != COUNT_OF(_ls));
	params->r = _rs[i];
	// определить fw
	for (i = 1, fw = W_OF_B(seed->ri[0]); seed->ri[i] > 32; ++i)
		fw += W_OF_B(seed->ri[i]);
	ASSERT(seed->ri[i] > 16);
	ASSERT(W_OF_B(seed->ri[i]) == 1);
	fw += 1;
	// определить gw
	for (i = 1, gw = W_OF_B(seed->di[0]); seed->di[i] > 32; ++i)
		gw += W_OF_B(seed->di[i]);
	ASSERT(seed->di[i] > 16);
	ASSERT(W_OF_B(seed->di[i]) == 1);
	gw += 1;
	ASSERT(gw > fw);
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	ASSERT(n <= gw);
	// создать состояние
	state = blobCreate(
		prngSTB_keep() + O_OF_W(gw) +
		O_OF_W(W_OF_B(seed->di[0]) + 2 * n) + zmMontCreate_keep(no) +
		utilMax(6,
			priNextPrimeW_deep(),
			priExtendPrime_deep(params->l, W_OF_B(seed->di[1]),
				(seed->di[0] + 3) / 4),
			priExtendPrime2_deep(params->l, W_OF_B(seed->di[0]),
				W_OF_B(seed->ri[0]), (params->l + 3) / 4),
			zmMontCreate_deep(no),
			zzDiv_deep(n, m),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	stb_state = (octet*)state;
	fi = gi = d = (word*)(stb_state + prngSTB_keep());
	g0 = gi + gw;
	p = g0 + W_OF_B(seed->di[0]);
	a = p + n;
	qr = (qr_o*)(a + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// запустить генератор
	prngSTBStart(stb_state, seed->zi);
	// построить цепочку gi
	offset = gw - 1;
	while (1)
	{
		// первое (минимальное) gi?
		if (seed->di[i] <= 32)
		{
			ASSERT(offset == gw - 1);
			do
			{
				prngSTBStepR(gi + offset, O_OF_B(seed->di[i]), stb_state);
				wwFrom(gi + offset, gi + offset, O_OF_B(seed->di[i]));
				wwTrimHi(gi + offset, 1, seed->di[i] - 1);
				wwSetBit(gi + offset, seed->di[i] - 1, 1);
			}
			while (!priNextPrimeW(gi + offset, gi[offset], stack));
		}
		// обычное gi
		else
		{
			trials = 4 * seed->di[i];
			base_count = (seed->di[i] + 3) / 4;
			// потенциальное отступление от СТБ, не влияющее на результат
			if (base_count > priBaseSize())
				base_count = priBaseSize();
			// не удается построить новое простое?
			if (!priExtendPrime(gi + offset, seed->di[i],
				gi + offset + W_OF_B(seed->di[i]), W_OF_B(seed->di[i + 1]),
				trials, base_count, prngSTBStepR, stb_state, stack))
			{
				// к предыдущему простому
				offset += W_OF_B(seed->di[i++]);
				continue;
			}
		}
		// последнее простое?
		if (i == 0)
			break;
		// к следующему простому
		offset -= W_OF_B(seed->di[--i]);
	}
	// сохранить g0
	wwCopy(g0, gi, W_OF_B(seed->di[0]));
	// построить цепочку fi
	while (1)
	{
		for (i = 1; seed->ri[i] > 32; ++i);
		offset = fw - 1;
		while (1)
		{
			// первое (минимальное) fi?
			if (seed->ri[i] <= 32)
			{
				ASSERT(offset == fw - 1);
				do
				{
					prngSTBStepR(fi + offset, O_OF_B(seed->ri[i]), stb_state);
					wwFrom(fi + offset, fi + offset, O_OF_B(seed->ri[i]));
					wwTrimHi(fi + offset, 1, seed->ri[i] - 1);
					wwSetBit(fi + offset, seed->ri[i] - 1, 1);
				}
				while (!priNextPrimeW(fi + offset, fi[offset], stack));
			}
			// обычное fi
			else
			{
				trials = 4 * seed->ri[i];
				base_count = (seed->ri[i] + 3) / 4;
				// потенциальное отступление от СТБ, не влияющее на результат
				if (base_count > priBaseSize())
					base_count = priBaseSize();
				// не удается построить новое простое?
				if (!priExtendPrime(fi + offset, seed->ri[i],
					fi + offset + W_OF_B(seed->ri[i]), W_OF_B(seed->ri[i + 1]),
					trials, base_count, prngSTBStepR, stb_state, stack))
				{
					// к предыдущему простому
					offset += W_OF_B(seed->ri[i++]);
					continue;
				}
			}
			// последнее простое?
			if (i == 0)
				break;
			// к следующему простому
			offset -= W_OF_B(seed->ri[--i]);
		}
		// построить p
		trials = 4 * seed->di[0];
		base_count = (seed->di[0] + 3) / 4;
		if (base_count > priBaseSize())
			base_count = priBaseSize();
		if (priExtendPrime2(p, params->l, g0, W_OF_B(seed->di[0]),
			fi, W_OF_B(seed->ri[0]), trials, base_count,
			prngSTBStepR, stb_state, stack))
			break;

	}
	// сохранить p и q
	wwTo(params->p, no, p);
	wwTo(params->q, mo, fi);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// p <- (p - 1) / q
	zzSubW2(p, n, 1);
	zzDiv(p, a, p, n, gi, m, stack);
	// d <- 5
	memSetZero(params->d, no);
	params->d[0] = 5;
	VERIFY(qrFrom(d, params->d, qr, stack));
	// сгенерировать a
	while (1)
	{
		// a <- d^((p - 1)/q)
		qrPower(a, d, p, n - m + 1, qr, stack);
		// a != e?
		if (!qrIsUnity(a, qr))
			break;
		// d <- d + 1
		zzAddWMod(d, d, 1, qr->mod, n);
	}
	// сохранить a и d
	wwTo(params->a, no, a);
	wwTo(params->d, no, d);
	// все нормально
	blobClose(state);
	return ERR_OK;
}